

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O0

bool * __thiscall
iDynTree::optimalcontrol::HessianBlocksMap::operator()(HessianBlocksMap *this,size_t row,size_t col)

{
  bool bVar1;
  pointer ppVar2;
  size_t in_RDX;
  size_t in_RSI;
  CollocationHessianIndex *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<CollocationHessianIndex,_bool>_>::value,_pair<iterator,_bool>_>
  _Var3;
  pair<std::_Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>,_bool>
  result;
  iterator it;
  CollocationHessianIndex indices;
  map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>_>
  *in_stack_ffffffffffffff78;
  pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>
  *in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff91;
  bool local_60 [24];
  _Base_ptr local_48;
  undefined1 local_40;
  _Self local_38;
  _Self local_30;
  CollocationHessianIndex local_28 [2];
  
  integrators::CollocationHessianIndex::CollocationHessianIndex(local_28,in_RSI,in_RDX);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x338069);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>_>
       ::end(in_stack_ffffffffffffff78);
  bVar1 = std::operator==(&local_30,&local_38);
  if (bVar1) {
    std::make_pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex&,bool>
              (in_RDI,local_60);
    _Var3 = std::
            map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,bool,std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,std::allocator<std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex_const,bool>>>
            ::insert<std::pair<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,bool>>
                      ((map<iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool,_std::less<iDynTree::optimalcontrol::integrators::CollocationHessianIndex>,_std::allocator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>_>
                        *)CONCAT71(in_stack_ffffffffffffff91,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
    local_48 = (_Base_ptr)_Var3.first._M_node;
    local_40 = _Var3.second;
    local_30._M_node = local_48;
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_iDynTree::optimalcontrol::integrators::CollocationHessianIndex,_bool>_>
                         *)0x3380ec);
  return &ppVar2->second;
}

Assistant:

bool& operator()(size_t row, size_t col) {
                CollocationHessianIndex indices(row, col);
                std::map<CollocationHessianIndex, bool>::iterator it = m_map.find(indices);

                if (it == m_map.end()) {
                    std::pair<std::map<CollocationHessianIndex, bool>::iterator, bool> result = m_map.insert(std::make_pair(indices, false));
                    it = result.first;
                }
                return it->second;
            }